

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_OnlyPredictedFeatureName(void)

{
  undefined8 uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureType *pFVar4;
  DictionaryFeatureType *this;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  FeatureDescription *pFVar6;
  ArrayFeatureType *pAVar7;
  reference from;
  ostream *poVar8;
  Result local_270;
  FeatureDescription *local_248;
  FeatureDescription *trainingInputModel;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInputTarget;
  int i;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  Result local_1c8;
  FeatureDescription *local_1a0;
  FeatureDescription *trainingInput;
  _Rb_tree_node_base _Stack_190;
  size_t sStack_170;
  set<long,_std::less<long>,_std::allocator<long>_> local_168;
  set<long,_std::less<long>,_std::allocator<long>_> local_138;
  FeatureDescription *local_100;
  FeatureDescription *outputProbs;
  FeatureDescription *output;
  undefined1 local_e8 [8];
  string probsName;
  undefined1 local_c0 [8];
  string predictedFeatureName;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [8];
  Result res;
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_75a77;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_75a8e;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)((long)&res.m_message.field_2 + 8),true,
             (TensorAttributes *)&tensorAttributesOut.dimension,(TensorAttributes *)&neuralNet,0x400
             ,false,false);
  CoreML::Specification::Model::set_specificationversion
            ((Model *)((long)&res.m_message.field_2 + 8),4);
  predictedFeatureName.field_2._8_8_ =
       CoreML::Specification::Model::mutable_neuralnetwork
                 ((Model *)((long)&res.m_message.field_2 + 8));
  addSoftmaxLayer((Model *)((long)&res.m_message.field_2 + 8),"softmax","OutTensor","softmax_out");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"predictedFeatures",
             (allocator<char> *)(probsName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(probsName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"probs",(allocator<char> *)((long)&output + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&output + 7));
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  outputProbs = CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(outputProbs,(string *)local_c0);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(outputProbs);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  local_100 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(local_100,(string *)local_e8);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(local_100);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(local_100);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar3,(string *)local_c0);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar3,(string *)local_e8)
  ;
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)((long)&res.m_message.field_2 + 8),
             (NeuralNetwork *)predictedFeatureName.field_2._8_8_,"cross_entropy_loss_layer",
             "softmax_out","target");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)predictedFeatureName.field_2._8_8_,kSgdOptimizer,0.699999988079071,0.0
             ,1.0);
  uVar1 = predictedFeatureName.field_2._8_8_;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_138._M_t._M_impl._0_8_ = 0;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_138);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)uVar1,kSgdOptimizer,10,5,100,&local_138);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_138);
  uVar1 = predictedFeatureName.field_2._8_8_;
  local_168._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_168._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_168._M_t._M_impl._0_8_ = 0;
  local_168._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_168._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_168);
  addEpochs<CoreML::Specification::NeuralNetwork>((NeuralNetwork *)uVar1,100,1,100,&local_168);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_168);
  uVar1 = predictedFeatureName.field_2._8_8_;
  _Stack_190._M_right = (_Base_ptr)0x0;
  sStack_170 = 0;
  _Stack_190._M_parent = (_Base_ptr)0x0;
  _Stack_190._M_left = (_Base_ptr)0x0;
  trainingInput = (FeatureDescription *)0x0;
  _Stack_190._M_color = _S_red;
  _Stack_190._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)uVar1,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar3);
  pMVar3 = CoreML::Specification::Model::mutable_description
                     ((Model *)((long)&res.m_message.field_2 + 8));
  pRVar5 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
  local_1a0 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                        (pRVar5);
  CoreML::Specification::FeatureDescription::set_name(local_1a0,(string *)local_c0);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(local_1a0);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  CoreML::Model::validate(&local_1c8,(Model *)((long)&res.m_message.field_2 + 8));
  CoreML::Result::operator=((Result *)local_68,&local_1c8);
  CoreML::Result::~Result(&local_1c8);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (bVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x60a);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    pMVar3 = CoreML::Specification::Model::mutable_description
                       ((Model *)((long)&res.m_message.field_2 + 8));
    CoreML::Specification::ModelDescription::clear_output(pMVar3);
    pMVar3 = CoreML::Specification::Model::mutable_description
                       ((Model *)((long)&res.m_message.field_2 + 8));
    pFVar6 = CoreML::Specification::ModelDescription::add_output(pMVar3);
    CoreML::Specification::FeatureDescription::set_name(pFVar6,(char *)neuralNet);
    pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar6);
    pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (pAVar7,ArrayFeatureType_ArrayDataType_FLOAT32);
    for (trainingInputTarget._4_4_ = 0; trainingInputTarget._4_4_ < (int)tensorAttributesOut.name;
        trainingInputTarget._4_4_ = trainingInputTarget._4_4_ + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(pAVar7,1);
    }
    pMVar3 = CoreML::Specification::Model::mutable_description
                       ((Model *)((long)&res.m_message.field_2 + 8));
    pRVar5 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
    pFVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (pRVar5);
    CoreML::Specification::FeatureDescription::set_name(pFVar6,"target");
    pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar6);
    pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (pAVar7,ArrayFeatureType_ArrayDataType_INT32);
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar7,1);
    pMVar3 = CoreML::Specification::Model::description((Model *)((long)&res.m_message.field_2 + 8));
    pRVar5 = CoreML::Specification::ModelDescription::input(pMVar3);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar5);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar5);
    while( true ) {
      bVar2 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                        (&__end1,(iterator *)&feature._cached_size_);
      if (!bVar2) break;
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInputModel,from);
      pMVar3 = CoreML::Specification::Model::mutable_description
                         ((Model *)((long)&res.m_message.field_2 + 8));
      pRVar5 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
      local_248 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (pRVar5);
      CoreML::Specification::FeatureDescription::CopyFrom
                (local_248,(FeatureDescription *)&trainingInputModel);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInputModel);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
    }
    CoreML::Model::validate(&local_270,(Model *)((long)&res.m_message.field_2 + 8));
    CoreML::Result::operator=((Result *)local_68,&local_270);
    CoreML::Result::~Result(&local_270);
    bVar2 = CoreML::Result::good((Result *)local_68);
    if (bVar2) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x621);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,"(res).good()");
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_c0);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)((long)&res.m_message.field_2 + 8));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_OnlyPredictedFeatureName() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier, but we'll describe these things in the spec anyway to check this edge-case
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);


    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", "target");

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(predictedFeatureName);
    trainingInput->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Remove predictedFeatureName from model's outputs and add target and model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}